

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O2

void icetDataReplicationGroup(IceTInt size,IceTInt *processes)

{
  int *piVar1;
  long lVar2;
  IceTInt size_local;
  IceTInt rank;
  
  size_local = size;
  icetGetIntegerv(2,&rank);
  lVar2 = 0;
  do {
    if (size <= lVar2) {
      icetRaiseDiagnostic("Local process not part of data replication group.",0xfffffffa,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                          ,0x7e);
      return;
    }
    piVar1 = processes + lVar2;
    lVar2 = lVar2 + 1;
  } while (*piVar1 != rank);
  icetStateSetIntegerv(0x2d,1,&size_local);
  icetStateSetIntegerv(0x2c,size_local,processes);
  return;
}

Assistant:

void icetDataReplicationGroup(IceTInt size, const IceTInt *processes)
{
    IceTInt rank;
    IceTBoolean found_myself = ICET_FALSE;
    IceTInt i;

    icetGetIntegerv(ICET_RANK, &rank);
    for (i = 0; i < size; i++) {
        if (processes[i] == rank) {
            found_myself = ICET_TRUE;
            break;
        }
    }

    if (!found_myself) {
        icetRaiseError("Local process not part of data replication group.",
                       ICET_INVALID_VALUE);
        return;
    }

    icetStateSetIntegerv(ICET_DATA_REPLICATION_GROUP_SIZE, 1, &size);
    icetStateSetIntegerv(ICET_DATA_REPLICATION_GROUP, size, processes);
}